

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O1

string * __thiscall
t_py_generator::render_const_value_abi_cxx11_
          (string *__return_storage_ptr__,t_py_generator *this,t_type *type,t_const_value *value)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  _func_int *p_Var4;
  long lVar5;
  long lVar6;
  size_t __n;
  int iVar7;
  t_const_value_type tVar8;
  t_type *ttype;
  ostream *poVar9;
  t_type *ptVar10;
  int64_t iVar11;
  _Rb_tree_node_base *p_Var12;
  ostringstream *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  undefined4 extraout_var;
  long *plVar14;
  undefined4 extraout_var_00;
  size_type *psVar15;
  ulong uVar16;
  t_type *ptVar17;
  char *pcVar18;
  _func_int **pp_Var19;
  t_py_generator *ptVar20;
  pointer pptVar21;
  bool bVar22;
  undefined1 auVar23 [12];
  ostringstream out;
  string local_220;
  t_py_generator *local_200;
  string local_1f8;
  t_type *local_1d8;
  string *local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [376];
  
  local_200 = this;
  local_1d0 = __return_storage_ptr__;
  ttype = t_type::get_true_type(type);
  this_00 = (ostringstream *)local_1a8;
  std::__cxx11::ostringstream::ostringstream(this_00);
  iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if ((char)iVar7 == '\0') {
    iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[10])();
    if ((char)iVar7 == '\0') {
      iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])();
      if (((char)iVar7 == '\0') &&
         (iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(), (char)iVar7 == '\0')) {
        iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
        if ((char)iVar7 == '\0') {
          iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
          if (((char)iVar7 == '\0') &&
             (iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(), (char)iVar7 == '\0')) {
            pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      __cxa_allocate_exception(0x20);
            iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[3])();
            std::operator+(pbVar13,"CANNOT GENERATE CONSTANT FOR TYPE: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(extraout_var_00,iVar7));
            __cxa_throw(pbVar13,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
          ptVar20 = local_200;
          local_1d8 = *(t_type **)&ttype[1].super_t_doc.has_doc_;
          iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
          if ((char)iVar7 != '\0') {
            bVar22 = is_immutable(ttype);
            if (bVar22) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"frozen",6);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"set(",4);
          }
          bVar22 = is_immutable(ttype);
          if (bVar22) {
            pcVar18 = "(";
          }
          else {
            iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
            pcVar18 = "[";
            if ((char)iVar7 != '\0') {
              pcVar18 = "(";
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar18,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                     ::endl_abi_cxx11_._M_string_length);
          piVar1 = &(ptVar20->super_t_generator).indent_;
          *piVar1 = *piVar1 + 1;
          pptVar21 = (value->listVal_).
                     super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          if (pptVar21 !=
              (value->listVal_).
              super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            do {
              poVar9 = t_generator::indent(&ptVar20->super_t_generator,(ostream *)local_1a8);
              render_const_value_abi_cxx11_(&local_220,ptVar20,local_1d8,*pptVar21);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar9,local_220._M_dataplus._M_p,local_220._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_220._M_dataplus._M_p != &local_220.field_2) {
                operator_delete(local_220._M_dataplus._M_p);
              }
              pptVar21 = pptVar21 + 1;
            } while (pptVar21 !=
                     (value->listVal_).
                     super__Vector_base<t_const_value_*,_std::allocator<t_const_value_*>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          }
          piVar1 = &(ptVar20->super_t_generator).indent_;
          *piVar1 = *piVar1 + -1;
          bVar22 = is_immutable(ttype);
          if ((bVar22) || (iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(), (char)iVar7 != '\0'))
          {
            poVar9 = t_generator::indent(&local_200->super_t_generator,(ostream *)local_1a8);
            pcVar18 = "Throws -> tok_throws ( FieldList )";
          }
          else {
            poVar9 = t_generator::indent(&local_200->super_t_generator,(ostream *)local_1a8);
            pcVar18 = "ConstList => [ ConstListContents ]";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar18 + 0x21,1);
          iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
          if ((char)iVar7 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
          }
        }
        else {
          ptVar10 = *(t_type **)&ttype[1].super_t_doc.has_doc_;
          ptVar17 = *(t_type **)&ttype[1].annotations_._M_t._M_impl;
          bVar22 = is_immutable(ttype);
          if (bVar22) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"TFrozenDict(",0xc);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,::endl_abi_cxx11_._M_dataplus._M_p,
                     ::endl_abi_cxx11_._M_string_length);
          ptVar20 = local_200;
          piVar1 = &(local_200->super_t_generator).indent_;
          *piVar1 = *piVar1 + 1;
          for (p_Var12 = (value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var12 != &(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
              p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
            poVar9 = t_generator::indent(&ptVar20->super_t_generator,(ostream *)local_1a8);
            render_const_value_abi_cxx11_
                      (&local_220,ptVar20,ptVar10,*(t_const_value **)(p_Var12 + 1));
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,local_220._M_dataplus._M_p,local_220._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
            render_const_value_abi_cxx11_
                      (&local_1f8,ptVar20,ptVar17,(t_const_value *)p_Var12[1]._M_parent);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,(char *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                                        local_1f8._M_dataplus._M_p._0_1_),
                                local_1f8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) !=
                &local_1f8.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                       local_1f8._M_dataplus._M_p._0_1_));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p);
            }
          }
          piVar1 = &(ptVar20->super_t_generator).indent_;
          *piVar1 = *piVar1 + -1;
          poVar9 = t_generator::indent(&ptVar20->super_t_generator,(ostream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}",1);
          bVar22 = is_immutable(ttype);
          if (bVar22) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")",1);
          }
        }
      }
      else {
        ptVar20 = local_200;
        type_name_abi_cxx11_(&local_220,local_200,ttype);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,local_220._M_dataplus._M_p,
                            local_220._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(**{",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        paVar2 = &local_220.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != paVar2) {
          operator_delete(local_220._M_dataplus._M_p);
        }
        piVar1 = &(ptVar20->super_t_generator).indent_;
        *piVar1 = *piVar1 + 1;
        ptVar10 = (t_type *)(value->mapVal_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_1d8 = (t_type *)&(value->mapVal_)._M_t._M_impl.super__Rb_tree_header;
        if (ptVar10 != local_1d8) {
          do {
            pp_Var19 = ttype[1].super_t_doc._vptr_t_doc;
            if (pp_Var19 == (_func_int **)ttype[1].super_t_doc.doc_._M_dataplus._M_p) {
              ptVar17 = (t_type *)0x0;
            }
            else {
              ptVar17 = (t_type *)0x0;
              do {
                p_Var4 = *pp_Var19;
                lVar5 = *(long *)((long)&(ptVar10->super_t_doc).doc_.field_2 + 8);
                lVar6 = *(long *)(lVar5 + 0x48);
                local_220._M_dataplus._M_p = (pointer)paVar2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_220,lVar6,*(long *)(lVar5 + 0x50) + lVar6);
                __n = *(size_t *)(p_Var4 + 0x70);
                if (__n == local_220._M_string_length) {
                  if (__n == 0) {
                    bVar22 = true;
                  }
                  else {
                    iVar7 = bcmp(*(void **)(p_Var4 + 0x68),local_220._M_dataplus._M_p,__n);
                    bVar22 = iVar7 == 0;
                  }
                }
                else {
                  bVar22 = false;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220._M_dataplus._M_p != paVar2) {
                  operator_delete(local_220._M_dataplus._M_p);
                }
                if (bVar22) {
                  ptVar17 = *(t_type **)(*pp_Var19 + 0x60);
                }
                pp_Var19 = pp_Var19 + 1;
              } while (pp_Var19 != (_func_int **)ttype[1].super_t_doc.doc_._M_dataplus._M_p);
            }
            ptVar20 = local_200;
            if (ptVar17 == (t_type *)0x0) {
              pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        __cxa_allocate_exception(0x20);
              iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[3])();
              std::operator+(&local_1f8,"type error: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var,iVar7));
              plVar14 = (long *)std::__cxx11::string::append((char *)&local_1f8);
              local_220._M_dataplus._M_p = (pointer)*plVar14;
              psVar15 = (size_type *)(plVar14 + 2);
              if ((size_type *)local_220._M_dataplus._M_p == psVar15) {
                local_220.field_2._M_allocated_capacity = *psVar15;
                local_220.field_2._8_4_ = (undefined4)plVar14[3];
                local_220.field_2._12_4_ = *(undefined4 *)((long)plVar14 + 0x1c);
                local_220._M_dataplus._M_p = (pointer)paVar2;
              }
              else {
                local_220.field_2._M_allocated_capacity = *psVar15;
              }
              local_220._M_string_length = plVar14[1];
              *plVar14 = (long)psVar15;
              plVar14[1] = 0;
              *(undefined1 *)(plVar14 + 2) = 0;
              lVar5 = *(long *)((long)&(ptVar10->super_t_doc).doc_.field_2 + 8);
              local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
              lVar6 = *(long *)(lVar5 + 0x48);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1c8,lVar6,*(long *)(lVar5 + 0x50) + lVar6);
              std::operator+(pbVar13,&local_220,&local_1c8);
              __cxa_throw(pbVar13,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            }
            poVar9 = t_generator::indent(&local_200->super_t_generator,(ostream *)local_1a8);
            render_const_value_abi_cxx11_
                      (&local_220,ptVar20,g_type_string,
                       *(t_const_value **)((long)&(ptVar10->super_t_doc).doc_.field_2 + 8));
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,local_220._M_dataplus._M_p,local_220._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
            render_const_value_abi_cxx11_
                      (&local_1f8,ptVar20,ptVar17,
                       *(t_const_value **)&(ptVar10->super_t_doc).has_doc_);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,(char *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                                        local_1f8._M_dataplus._M_p._0_1_),
                                local_1f8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,",",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_1f8._M_dataplus._M_p._1_7_,local_1f8._M_dataplus._M_p._0_1_) !=
                &local_1f8.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_1f8._M_dataplus._M_p._1_7_,
                                       local_1f8._M_dataplus._M_p._0_1_));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != paVar2) {
              operator_delete(local_220._M_dataplus._M_p);
            }
            ptVar10 = (t_type *)std::_Rb_tree_increment((_Rb_tree_node_base *)ptVar10);
          } while (ptVar10 != local_1d8);
        }
        piVar1 = &(ptVar20->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
        poVar9 = t_generator::indent(&ptVar20->super_t_generator,(ostream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"})",2);
      }
    }
    else {
      t_const_value::get_integer(value);
      std::ostream::_M_insert<long>((long)local_1a8);
    }
    goto LAB_0030f710;
  }
  uVar3 = *(uint *)&ttype[1].super_t_doc._vptr_t_doc;
  switch(uVar3) {
  case 1:
    iVar7 = (*(ttype->super_t_doc)._vptr_t_doc[7])();
    if ((char)iVar7 != '\0') {
      local_220._M_dataplus._M_p._0_1_ = 0x62;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_220,1);
    }
    local_220._M_dataplus._M_p._0_1_ = 0x22;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)&local_220,1);
    t_generator::get_escaped_string_abi_cxx11_(&local_220,&local_200->super_t_generator,value);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_220._M_dataplus._M_p,local_220._M_string_length);
    local_1f8._M_dataplus._M_p._0_1_ = 0x22;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_1f8,1);
    break;
  case 2:
    iVar11 = t_const_value::get_integer(value);
    pcVar18 = "framed = False";
    if (0 < iVar11) {
      pcVar18 = "framed = True";
    }
    pcVar18 = pcVar18 + 9;
    uVar16 = (ulong)(0 < iVar11) ^ 5;
LAB_0030f708:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar18,uVar16);
    goto LAB_0030f710;
  case 3:
  case 4:
  case 5:
  case 6:
    t_const_value::get_integer(value);
    std::ostream::_M_insert<long>((long)local_1a8);
    goto LAB_0030f710;
  case 7:
    tVar8 = t_const_value::get_type(value);
    if (tVar8 == CV_INTEGER) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"float(",6);
      t_const_value::get_integer(value);
      this_00 = (ostringstream *)std::ostream::_M_insert<long>((long)local_1a8);
      uVar16 = 1;
      pcVar18 = ")";
      goto LAB_0030f708;
    }
    t_generator::emit_double_as_string_abi_cxx11_
              (&local_220,&local_200->super_t_generator,value->doubleVal_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
    break;
  default:
    auVar23 = __cxa_allocate_exception(0x20);
    t_base_type::t_base_name_abi_cxx11_(&local_220,(t_base_type *)(ulong)uVar3,auVar23._8_4_);
    std::operator+(auVar23._0_8_,"compiler error: no const of base type ",&local_220);
    __cxa_throw(auVar23._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
LAB_0030f710:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return local_1d0;
}

Assistant:

string t_py_generator::render_const_value(t_type* type, t_const_value* value) {
  type = get_true_type(type);
  std::ostringstream out;

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_STRING:
      if (((t_base_type*)type)->is_binary()) {
        out << 'b';
      }
      out << '"' << get_escaped_string(value) << '"';
      break;
    case t_base_type::TYPE_BOOL:
      out << (value->get_integer() > 0 ? "True" : "False");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      out << value->get_integer();
      break;
    case t_base_type::TYPE_DOUBLE:
      if (value->get_type() == t_const_value::CV_INTEGER) {
        out << "float(" << value->get_integer() << ")";
      } else {
        out << emit_double_as_string(value->get_double());
      }
      break;
    default:
      throw "compiler error: no const of base type " + t_base_type::t_base_name(tbase);
    }
  } else if (type->is_enum()) {
    out << value->get_integer();
  } else if (type->is_struct() || type->is_xception()) {
    out << type_name(type) << "(**{" << endl;
    indent_up();
    const vector<t_field*>& fields = ((t_struct*)type)->get_members();
    vector<t_field*>::const_iterator f_iter;
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      t_type* field_type = nullptr;
      for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
        if ((*f_iter)->get_name() == v_iter->first->get_string()) {
          field_type = (*f_iter)->get_type();
        }
      }
      if (field_type == nullptr) {
        throw "type error: " + type->get_name() + " has no field " + v_iter->first->get_string();
      }
      indent(out) << render_const_value(g_type_string, v_iter->first) << ": "
          << render_const_value(field_type, v_iter->second) << "," << endl;
    }
    indent_down();
    indent(out) << "})";
  } else if (type->is_map()) {
    t_type* ktype = ((t_map*)type)->get_key_type();
    t_type* vtype = ((t_map*)type)->get_val_type();
    if (is_immutable(type)) {
      out << "TFrozenDict(";
    }
    out << "{" << endl;
    indent_up();
    const map<t_const_value*, t_const_value*, t_const_value::value_compare>& val = value->get_map();
    map<t_const_value*, t_const_value*, t_const_value::value_compare>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      indent(out) << render_const_value(ktype, v_iter->first) << ": "
          << render_const_value(vtype, v_iter->second) << "," << endl;
    }
    indent_down();
    indent(out) << "}";
    if (is_immutable(type)) {
      out << ")";
    }
  } else if (type->is_list() || type->is_set()) {
    t_type* etype;
    if (type->is_list()) {
      etype = ((t_list*)type)->get_elem_type();
    } else {
      etype = ((t_set*)type)->get_elem_type();
    }
    if (type->is_set()) {
      if (is_immutable(type)) {
        out << "frozen";
      }
      out << "set(";
    }
    if (is_immutable(type) || type->is_set()) {
      out << "(" << endl;
    } else {
      out << "[" << endl;
    }
    indent_up();
    const vector<t_const_value*>& val = value->get_list();
    vector<t_const_value*>::const_iterator v_iter;
    for (v_iter = val.begin(); v_iter != val.end(); ++v_iter) {
      indent(out) << render_const_value(etype, *v_iter) << "," << endl;
    }
    indent_down();
    if (is_immutable(type) || type->is_set()) {
      indent(out) << ")";
    } else {
      indent(out) << "]";
    }
    if (type->is_set()) {
      out << ")";
    }
  } else {
    throw "CANNOT GENERATE CONSTANT FOR TYPE: " + type->get_name();
  }

  return out.str();
}